

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

size_t Extract(string *where_from,string *where_to,size_t pos,char *delim)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  long *local_38 [2];
  long local_28 [2];
  
  do {
    uVar2 = pos;
    uVar3 = 0;
    do {
      cVar1 = delim[uVar3];
      if (cVar1 == (where_from->_M_dataplus)._M_p[uVar2]) break;
      uVar3 = uVar3 + 1;
    } while (cVar1 != '\0');
    if ((cVar1 != '\0') || (pos = uVar2 + 1, where_from->_M_string_length <= uVar2)) {
      sVar4 = 0xffffffffffffffff;
      if (uVar2 != where_from->_M_string_length) {
        sVar4 = uVar2;
      }
      if (sVar4 == 0xffffffffffffffff) {
        std::__cxx11::string::_M_assign((string *)where_to);
      }
      else {
        std::__cxx11::string::substr((ulong)local_38,(ulong)where_from);
        std::__cxx11::string::operator=((string *)where_to,(string *)local_38);
        if (local_38[0] != local_28) {
          operator_delete(local_38[0],local_28[0] + 1);
        }
      }
      return sVar4;
    }
  } while( true );
}

Assistant:

size_t Extract(const std::string& where_from, std::string& where_to, size_t pos, const char* delim)
{
    size_t end = FindFirstOfSet(where_from, pos, delim);

    if (end != std::string::npos)
        where_to = where_from.substr(pos, end - pos);
    else
        where_to = where_from;

    return end;
}